

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsPosixTestProcess.cpp
# Opt level: O1

void __thiscall xs::PosixTestProcess::PosixTestProcess(PosixTestProcess *this)

{
  ThreadedByteBuffer *this_00;
  
  (this->super_TestProcess)._vptr_TestProcess = (_func_int **)&PTR__PosixTestProcess_0012b640;
  this->m_process = (Process *)0x0;
  this->m_processStartTime = 0;
  (this->m_logFileName)._M_dataplus._M_p = (pointer)&(this->m_logFileName).field_2;
  (this->m_logFileName)._M_string_length = 0;
  (this->m_logFileName).field_2._M_local_buf[0] = '\0';
  this_00 = &this->m_infoBuffer;
  de::BlockBuffer<unsigned_char>::BlockBuffer(this_00,0x40,0x80);
  de::Thread::Thread(&(this->m_caseListWriter).super_Thread);
  (this->m_caseListWriter).super_Thread._vptr_Thread = (_func_int **)&PTR__CaseListWriter_0012b5f0;
  (this->m_caseListWriter).m_file = (deFile *)0x0;
  (this->m_caseListWriter).m_caseList.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_caseListWriter).m_caseList.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_caseListWriter).m_caseList.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_caseListWriter).m_run = false;
  de::Thread::Thread(&(this->m_stdOutReader).super_Thread);
  (this->m_stdOutReader).super_Thread._vptr_Thread = (_func_int **)&PTR__PipeReader_0012b618;
  (this->m_stdOutReader).m_file = (deFile *)0x0;
  (this->m_stdOutReader).m_buf = this_00;
  de::Thread::Thread(&(this->m_stdErrReader).super_Thread);
  (this->m_stdErrReader).super_Thread._vptr_Thread = (_func_int **)&PTR__PipeReader_0012b618;
  (this->m_stdErrReader).m_file = (deFile *)0x0;
  (this->m_stdErrReader).m_buf = this_00;
  posix::FileReader::FileReader(&this->m_logReader,0x400,0x200);
  return;
}

Assistant:

PosixTestProcess::PosixTestProcess (void)
	: m_process				(DE_NULL)
	, m_processStartTime	(0)
	, m_infoBuffer			(INFO_BUFFER_BLOCK_SIZE, INFO_BUFFER_NUM_BLOCKS)
	, m_stdOutReader		(&m_infoBuffer)
	, m_stdErrReader		(&m_infoBuffer)
	, m_logReader			(LOG_BUFFER_BLOCK_SIZE, LOG_BUFFER_NUM_BLOCKS)
{
}